

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

void __thiscall
gutil::Properties::putValueVector<std::__cxx11::string>
          (Properties *this,char *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value,char sep)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  ostringstream out;
  string sStack_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar3 = (value->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pbVar1 = (value->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 <= pbVar3 + 1) break;
    poVar2 = std::operator<<((ostream *)local_1a8,(string *)pbVar3);
    std::operator<<(poVar2,sep);
    pbVar3 = pbVar3 + 1;
  }
  if (pbVar3 < pbVar1) {
    std::operator<<((ostream *)local_1a8,(string *)pbVar3);
  }
  std::__cxx11::stringbuf::str();
  putString(this,key,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void putValueVector(const char *key,
                                           const std::vector<T> &value, const char sep='|')
    {
      std::ostringstream out;
      typename std::vector<T>::const_iterator it;

      for (it=value.begin(); it+1<value.end(); ++it)
      {
        out << *it << sep;
      }

      if (it < value.end())
      {
        out << *it;
      }

      putString(key, out.str());
    }